

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_convert_db.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  pointer puVar1;
  pointer puVar2;
  int iVar3;
  int iVar4;
  DatabaseInterface *pDVar5;
  DatabaseInterface *pDVar6;
  pointer puVar7;
  ResourceTag tag;
  uint uVar8;
  ulong uVar9;
  byte bVar10;
  size_t hash_count;
  size_t blob_size;
  vector<unsigned_char,_std::allocator<unsigned_char>_> blob;
  vector<unsigned_long,_std::allocator<unsigned_long>_> hashes;
  allocator_type local_79;
  size_type local_78;
  DatabaseInterface *local_70;
  size_type local_68;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_60;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  
  if (argc == 3) {
    iVar4 = 1;
    pDVar5 = Fossilize::create_database(argv[1],ReadOnly);
    pDVar6 = Fossilize::create_database(argv[2],OverWrite);
    local_70 = pDVar6;
    if ((pDVar5 == (DatabaseInterface *)0x0) ||
       (iVar3 = (*pDVar5->_vptr_DatabaseInterface[2])(pDVar5), (char)iVar3 == '\0')) {
      main_cold_3();
    }
    else if ((pDVar6 == (DatabaseInterface *)0x0) ||
            (iVar4 = (*pDVar6->_vptr_DatabaseInterface[2])(pDVar6), (char)iVar4 == '\0')) {
      main_cold_2();
LAB_0010fd71:
      iVar4 = 1;
    }
    else {
      iVar4 = 0;
      uVar9 = 0;
      do {
        local_78 = 0;
        iVar3 = (*pDVar5->_vptr_DatabaseInterface[6])(pDVar5,uVar9,&local_78,0);
        if ((char)iVar3 == '\0') goto LAB_0010fd71;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  (&local_48,local_78,(allocator_type *)&local_60);
        iVar3 = (*pDVar5->_vptr_DatabaseInterface[6])(pDVar5,uVar9,&local_78);
        puVar2 = local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if ((char)iVar3 == '\0') {
LAB_0010fd19:
          bVar10 = 1;
          iVar4 = 1;
        }
        else {
          puVar1 = local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          if (local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start ==
              local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            bVar10 = 0;
          }
          else {
            do {
              puVar7 = puVar1 + 1;
              local_68 = 0;
              iVar3 = (*pDVar5->_vptr_DatabaseInterface[3])(pDVar5,uVar9,*puVar1,&local_68,0,0);
              if ((char)iVar3 == '\0') goto LAB_0010fd19;
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                        (&local_60,local_68,&local_79);
              iVar3 = (*pDVar5->_vptr_DatabaseInterface[3])(pDVar5,uVar9,*puVar1);
              if ((char)iVar3 == '\0') {
                iVar4 = 1;
                bVar10 = 1;
              }
              else {
                iVar3 = (*local_70->_vptr_DatabaseInterface[4])(local_70,uVar9,*puVar1);
                if ((byte)iVar3 == 0) {
                  iVar4 = 1;
                }
                bVar10 = (byte)iVar3 ^ 1;
              }
              if (local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_60.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_60.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_60.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              puVar1 = puVar7;
            } while ((puVar7 == puVar2 | bVar10) != 1);
          }
        }
        if (local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_48.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_48.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        uVar8 = (int)uVar9 + 1;
        uVar9 = (ulong)uVar8;
      } while ((bVar10 | uVar8 == 10) != 1);
    }
    if (local_70 != (DatabaseInterface *)0x0) {
      (*local_70->_vptr_DatabaseInterface[1])();
    }
    if (pDVar5 != (DatabaseInterface *)0x0) {
      (*pDVar5->_vptr_DatabaseInterface[1])(pDVar5);
    }
  }
  else {
    main_cold_1();
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

int main(int argc, char *argv[])
{
	if (argc != 3)
	{
		print_help();
		return EXIT_FAILURE;
	}

	auto input_db = std::unique_ptr<DatabaseInterface>(create_database(argv[1], DatabaseMode::ReadOnly));
	auto output_db = std::unique_ptr<DatabaseInterface>(create_database(argv[2], DatabaseMode::OverWrite));
	if (!input_db || !input_db->prepare())
	{
		LOGE("Failed to load database: %s\n", argv[1]);
		return EXIT_FAILURE;
	}

	if (!output_db || !output_db->prepare())
	{
		LOGE("Failed to open database for writing: %s\n", argv[2]);
		return EXIT_FAILURE;
	}

	for (unsigned i = 0; i < RESOURCE_COUNT; i++)
	{
		auto tag = static_cast<ResourceTag>(i);

		size_t hash_count = 0;
		if (!input_db->get_hash_list_for_resource_tag(tag, &hash_count, nullptr))
			return EXIT_FAILURE;
		std::vector<Hash> hashes(hash_count);
		if (!input_db->get_hash_list_for_resource_tag(tag, &hash_count, hashes.data()))
			return EXIT_FAILURE;

		for (auto &hash : hashes)
		{
			size_t blob_size = 0;
			if (!input_db->read_entry(tag, hash, &blob_size, nullptr, PAYLOAD_READ_NO_FLAGS))
				return EXIT_FAILURE;
			std::vector<uint8_t> blob(blob_size);
			if (!input_db->read_entry(tag, hash, &blob_size, blob.data(), PAYLOAD_READ_NO_FLAGS))
				return EXIT_FAILURE;

			if (!output_db->write_entry(tag, hash, blob.data(), blob.size(),
					PAYLOAD_WRITE_COMPUTE_CHECKSUM_BIT |
					PAYLOAD_WRITE_COMPRESS_BIT |
					PAYLOAD_WRITE_BEST_COMPRESSION_BIT))
			{
				return EXIT_FAILURE;
			}
		}
	}
}